

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCodewordDecoder.cpp
# Opt level: O1

int ZXing::Pdf417::CodewordDecoder::GetDecodedValue(array<int,_8UL> *moduleBitCount)

{
  int *piVar1;
  size_t i;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  anon_class_1_0_00000001 *this;
  ulong uVar6;
  vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_> *__return_storage_ptr__;
  uint uVar7;
  bool bVar8;
  int iVar9;
  float fVar10;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar11 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  ModuleBitCountType result;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  iVar9 = 0;
  iVar12 = 0;
  iVar13 = 0;
  iVar14 = 0;
  lVar2 = 0;
  do {
    piVar1 = moduleBitCount->_M_elems + lVar2;
    iVar9 = iVar9 + *piVar1;
    iVar12 = iVar12 + piVar1[1];
    iVar13 = iVar13 + piVar1[2];
    iVar14 = iVar14 + piVar1[3];
    lVar2 = lVar2 + 4;
  } while (lVar2 != 8);
  local_28 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  fVar10 = (float)(iVar14 + iVar12 + iVar13 + iVar9);
  iVar12 = 0;
  this = (anon_class_1_0_00000001 *)0x0;
  iVar9 = 0;
  do {
    uVar7 = (uint)this;
    uVar4 = moduleBitCount->_M_elems[iVar12] + uVar7;
    if ((float)(int)uVar4 <= ((float)iVar9 * fVar10) / 17.0 + fVar10 / 34.0) {
      iVar12 = iVar12 + 1;
      this = (anon_class_1_0_00000001 *)CONCAT71((int7)((ulong)this >> 8),1);
      uVar7 = uVar4;
      if (iVar12 != 8) goto LAB_0016f149;
    }
    else {
LAB_0016f149:
      *(int *)(local_38 + (long)iVar12 * 4) = *(int *)(local_38 + (long)iVar12 * 4) + 1;
      this = (anon_class_1_0_00000001 *)0x0;
      uVar4 = uVar7;
    }
    if ((char)this != '\0') break;
    this = (anon_class_1_0_00000001 *)(ulong)uVar4;
    bVar8 = iVar9 != 0x10;
    iVar9 = iVar9 + 1;
  } while (bVar8);
  lVar2 = 0;
  uVar7 = 0;
  do {
    iVar9 = *(int *)(local_38 + lVar2 * 4);
    if (0 < iVar9) {
      do {
        uVar7 = ((uint)lVar2 & 1) + uVar7 * 2 ^ 1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  iVar9 = GetCodeword(uVar7);
  if (iVar9 == -1) {
    uVar7 = 0xffffffff;
  }
  if (uVar7 == 0xffffffff) {
    if (GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable == '\0') {
      __return_storage_ptr__ =
           (vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_> *)
           &GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable;
      iVar9 = __cxa_guard_acquire();
      if (iVar9 != 0) {
        GetClosestDecodedValue::anon_class_1_0_00000001::operator()(__return_storage_ptr__,this);
        __cxa_atexit(std::vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_>::
                     ~vector,&GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable,
                     &__dso_handle);
        __cxa_guard_release();
      }
    }
    iVar9 = 0;
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    lVar2 = 0;
    do {
      piVar1 = moduleBitCount->_M_elems + lVar2;
      iVar9 = iVar9 + *piVar1;
      iVar12 = iVar12 + piVar1[1];
      iVar13 = iVar13 + piVar1[2];
      iVar14 = iVar14 + piVar1[3];
      lVar2 = lVar2 + 4;
    } while (lVar2 != 8);
    iVar9 = iVar14 + iVar12 + iVar13 + iVar9;
    local_28 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    if (1 < iVar9) {
      auVar11._0_4_ = (float)iVar9;
      auVar11._4_4_ = auVar11._0_4_;
      auVar11._8_4_ = auVar11._0_4_;
      auVar11._12_4_ = auVar11._0_4_;
      lVar2 = 0;
      do {
        piVar1 = moduleBitCount->_M_elems + lVar2;
        auVar17._0_4_ = (float)*piVar1;
        auVar17._4_4_ = (float)piVar1[1];
        auVar17._8_4_ = (float)piVar1[2];
        auVar17._12_4_ = (float)piVar1[3];
        auVar17 = divps(auVar17,auVar11);
        *(undefined1 (*) [16])(local_38 + lVar2 * 4) = auVar17;
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
    }
    if (DAT_001fcf38 - GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable == 0) {
      uVar7 = 0xffffffff;
    }
    else {
      lVar3 = DAT_001fcf38 - GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable >> 5;
      uVar7 = 0xffffffff;
      fVar10 = 3.4028235e+38;
      lVar5 = 0;
      lVar2 = GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable;
      do {
        fVar16 = 0.0;
        uVar6 = 0;
        do {
          fVar15 = *(float *)(lVar2 + uVar6 * 4) - *(float *)(local_38 + uVar6 * 4);
          fVar16 = fVar15 * fVar15 + fVar16;
          if (6 < uVar6) break;
          uVar6 = uVar6 + 1;
        } while (fVar16 < fVar10);
        if (fVar16 < fVar10) {
          uVar7 = (ushort)(&SYMBOL_TABLE)[(int)lVar5] | 0x10000;
          fVar10 = fVar16;
        }
        lVar5 = lVar5 + 1;
        lVar2 = lVar2 + 0x20;
      } while (lVar5 != lVar3 + (ulong)(lVar3 == 0));
    }
  }
  return uVar7;
}

Assistant:

int
CodewordDecoder::GetDecodedValue(const std::array<int, BARS_IN_MODULE>& moduleBitCount)
{
	int decodedValue = GetDecodedCodewordValue(SampleBitCounts(moduleBitCount));
	if (decodedValue != -1) {
		return decodedValue;
	}
	return GetClosestDecodedValue(moduleBitCount);
}